

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControl::setExtraSelections
          (QWidgetTextControl *this,QList<QTextEdit::ExtraSelection> *selections)

{
  QList<QAbstractTextDocumentLayout::Selection> *this_00;
  byte bVar1;
  int iVar2;
  ExtraSelection *pEVar3;
  long lVar4;
  Span *pSVar5;
  Entry *pEVar6;
  const_iterator it;
  Data *pDVar7;
  char cVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  pointer pSVar13;
  ulong uVar14;
  uchar *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QRectF local_98;
  QMultiHash<int,_int> local_78;
  const_iterator local_68;
  void *local_48;
  QRectF *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar16 = *(long *)(this + 8);
  local_78.d = (Data *)0x0;
  local_78.m_size = 0;
  local_48 = (void *)((ulong)local_48 & 0xffffffff00000000);
  if (*(long *)(lVar16 + 0x130) != 0) {
    do {
      uVar9 = QTextCursor::anchor();
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)CONCAT44(local_68.i.d._4_4_,uVar9);
      QMultiHash<int,int>::emplace<int_const&>
                ((iterator *)&local_98,&local_78,(int *)&local_68,(int *)&local_48);
      lVar12 = (long)(int)local_48;
      local_48 = (void *)CONCAT44(local_48._4_4_,(int)(lVar12 + 1));
    } while (lVar12 + 1 < *(long *)(lVar16 + 0x130));
  }
  if ((selections->d).size == 0) {
    uVar18 = 0;
  }
  else {
    lVar12 = 0;
    uVar14 = 0;
    do {
      pEVar3 = (selections->d).ptr;
      local_68.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      uVar9 = QTextCursor::anchor();
      local_98.xp = (qreal)CONCAT44(local_98.xp._4_4_,uVar9);
      QMultiHash<int,_int>::constFindImpl<int>(&local_68,&local_78,(int *)&local_98);
      if (local_68.e == (Chain **)0x0) {
LAB_004c68e9:
        local_98.w = -NAN;
        local_98.h._0_4_ = 0xffffffff;
        local_98.h._4_4_ = 0xffffffff;
        local_98.xp = -NAN;
        local_98.yp._0_4_ = 0xffffffff;
        local_98.yp._4_4_ = 0xffffffff;
        selectionRect(&local_98,this,&pEVar3->cursor + lVar12);
        cVar8 = QTextFormat::boolProperty((int)pEVar3 + (int)lVar12 + 8);
        if (cVar8 != '\0') {
          local_98.xp = (0.0 - local_98.xp) + local_98.xp;
          local_98.w = 2147483647.0;
        }
        local_48 = (void *)0x0;
        local_40 = &local_98;
        QMetaObject::activate((QObject *)this,&staticMetaObject,7,&local_48);
      }
      else {
        iVar2 = (*local_68.e)->value;
        lVar4 = *(long *)(lVar16 + 0x128);
        iVar10 = QTextCursor::position();
        iVar11 = QTextCursor::position();
        if ((iVar10 != iVar11) ||
           (cVar8 = QTextFormat::operator==
                              ((QTextFormat *)((long)iVar2 * 0x18 + lVar4 + 8),
                               &(pEVar3->format).super_QTextFormat + lVar12), cVar8 == '\0'))
        goto LAB_004c68e9;
        it.i.bucket = local_68.i.bucket;
        it.i.d = local_68.i.d;
        it.e = local_68.e;
        QMultiHash<int,_int>::erase((iterator *)&local_98,&local_78,it);
      }
      uVar14 = uVar14 + 1;
      uVar18 = (selections->d).size;
      lVar12 = lVar12 + 0x18;
    } while (uVar14 < uVar18);
  }
  this_00 = (QList<QAbstractTextDocumentLayout::Selection> *)(lVar16 + 0x120);
  pDVar7 = local_78.d;
  if (local_78.d == (Data *)0x0) {
LAB_004c6b4d:
    QList<QAbstractTextDocumentLayout::Selection>::resize(this_00,uVar18);
    if ((selections->d).size != 0) {
      lVar16 = 8;
      uVar18 = 0;
      do {
        pEVar3 = (selections->d).ptr;
        pSVar13 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
        QTextCursor::operator=
                  ((QTextCursor *)((long)pSVar13 + lVar16 + -8),
                   (QTextCursor *)((long)pEVar3 + lVar16 + -8));
        pEVar3 = (selections->d).ptr;
        pSVar13 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
        QTextFormat::operator=
                  ((QTextFormat *)(&pSVar13->cursor + lVar16),
                   (QTextFormat *)(&pEVar3->cursor + lVar16));
        uVar18 = uVar18 + 1;
        lVar16 = lVar16 + 0x18;
      } while (uVar18 < (ulong)(selections->d).size);
    }
    QMultiHash<int,_int>::~QMultiHash(&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  pSVar5 = (local_78.d)->spans;
  if (pSVar5->offsets[0] == 0xff) {
    uVar14 = 1;
    do {
      uVar17 = uVar14;
      if ((local_78.d)->numBuckets == uVar17) goto LAB_004c6b4d;
      uVar14 = uVar17 + 1;
    } while (pSVar5[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
  }
  else {
    uVar17 = 0;
  }
  pEVar6 = pSVar5[uVar17 >> 7].entries + pSVar5[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f];
  do {
    do {
      puVar15 = (pEVar6->storage).data + 8;
      iVar2 = **(int **)puVar15;
      lVar12 = *(long *)(lVar16 + 0x128);
      local_98.w = -NAN;
      local_98.h._0_4_ = 0xffffffff;
      local_98.h._4_4_ = 0xffffffff;
      local_98.xp = -NAN;
      local_98.yp._0_4_ = 0xffffffff;
      local_98.yp._4_4_ = 0xffffffff;
      selectionRect(&local_98,this,(QTextCursor *)(lVar12 + (long)iVar2 * 0x18));
      cVar8 = QTextFormat::boolProperty((int)lVar12 + iVar2 * 0x18 + 8);
      if (cVar8 != '\0') {
        local_98.xp = (0.0 - local_98.xp) + local_98.xp;
        local_98.w = 2147483647.0;
      }
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0;
      local_68.i.bucket = (size_t)&local_98;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_68);
      pEVar6 = *(Entry **)puVar15;
    } while (*(long *)((pEVar6->storage).data + 8) != 0);
    do {
      if (pDVar7->numBuckets - 1 == uVar17) {
        uVar18 = (selections->d).size;
        goto LAB_004c6b4d;
      }
      uVar17 = uVar17 + 1;
      pSVar5 = pDVar7->spans;
      bVar1 = pSVar5[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f];
    } while (bVar1 == 0xff);
    pEVar6 = pSVar5[uVar17 >> 7].entries + bVar1;
  } while( true );
}

Assistant:

void QWidgetTextControl::setExtraSelections(const QList<QTextEdit::ExtraSelection> &selections)
{
    Q_D(QWidgetTextControl);

    QMultiHash<int, int> hash;
    for (int i = 0; i < d->extraSelections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(i);
        hash.insert(esel.cursor.anchor(), i);
    }

    for (int i = 0; i < selections.size(); ++i) {
        const QTextEdit::ExtraSelection &sel = selections.at(i);
        const auto it = hash.constFind(sel.cursor.anchor());
        if (it != hash.cend()) {
            const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
            if (esel.cursor.position() == sel.cursor.position()
                && esel.format == sel.format) {
                hash.erase(it);
                continue;
            }
        }
        QRectF r = selectionRect(sel.cursor);
        if (sel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    for (auto it = hash.cbegin(); it != hash.cend(); ++it) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
        QRectF r = selectionRect(esel.cursor);
        if (esel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    d->extraSelections.resize(selections.size());
    for (int i = 0; i < selections.size(); ++i) {
        d->extraSelections[i].cursor = selections.at(i).cursor;
        d->extraSelections[i].format = selections.at(i).format;
    }
}